

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

void Ptex::v2_2::ConvertToFloat(float *dst,void *src,DataType dt,int numChannels)

{
  int in_ECX;
  float in_EDX;
  float *in_RSI;
  float *in_RDI;
  float in_stack_ffffffffffffffdc;
  
  switch(in_EDX) {
  case 0.0:
    (anonymous_namespace)::ConvertArray<float,unsigned_char_const>
              (in_RDI,(uchar *)in_RSI,in_ECX,0.003921569,0.0);
    break;
  case 1.4013e-45:
    (anonymous_namespace)::ConvertArray<float,unsigned_short_const>
              (in_RDI,(unsigned_short *)in_RSI,in_ECX,1.5259022e-05,0.0);
    break;
  case 2.8026e-45:
    (anonymous_namespace)::ConvertArray<float,Ptex::v2_2::PtexHalf_const>
              (in_RSI,(PtexHalf *)CONCAT44(in_EDX,in_ECX),0,in_EDX,in_stack_ffffffffffffffdc);
    break;
  case 4.2039e-45:
    memcpy(in_RDI,in_RSI,(long)in_ECX << 2);
  }
  return;
}

Assistant:

void ConvertToFloat(float* dst, const void* src, DataType dt, int numChannels)
{
    switch (dt) {
    case dt_uint8:  ConvertArray(dst, static_cast<const uint8_t*>(src),  numChannels, 1.f/255.f); break;
    case dt_uint16: ConvertArray(dst, static_cast<const uint16_t*>(src), numChannels, 1.f/65535.f); break;
    case dt_half:   ConvertArray(dst, static_cast<const PtexHalf*>(src), numChannels, 1.f); break;
    case dt_float:  memcpy(dst, src, sizeof(float)*numChannels); break;
    }
}